

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp
# Opt level: O1

char * __thiscall
glcts::GeometryShaderLayeredRenderingBoundaryCondition::getVertexShaderCode
          (GeometryShaderLayeredRenderingBoundaryCondition *this)

{
  return 
  "${VERSION}\n\nprecision highp float;\n\nflat out int layer_id;\n\nvoid main()\n{\n    layer_id = 0;\n}\n"
  ;
}

Assistant:

const char* GeometryShaderLayeredRenderingBoundaryCondition::getVertexShaderCode()
{
	static const char* result = "${VERSION}\n"
								"\n"
								"precision highp float;\n"
								"\n"
								"flat out int layer_id;\n"
								"\n"
								"void main()\n"
								"{\n"
								"    layer_id = 0;\n"
								"}\n";

	return result;
}